

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_op_load_fpr_QT1(TCGContext_conflict8 *tcg_ctx,uint src)

{
  uint src_local;
  TCGContext_conflict8 *tcg_ctx_local;
  
  tcg_gen_st_i64_sparc64(tcg_ctx,(TCGv_i32)tcg_ctx->cpu_fpr[src >> 1],tcg_ctx->cpu_env,0x1b30);
  tcg_gen_st_i64_sparc64(tcg_ctx,(TCGv_i32)tcg_ctx->cpu_fpr[(src >> 1) + 1],tcg_ctx->cpu_env,0x1b28)
  ;
  return;
}

Assistant:

static void gen_op_load_fpr_QT1(TCGContext *tcg_ctx, unsigned int src)
{
    tcg_gen_st_i64(tcg_ctx, tcg_ctx->cpu_fpr[src / 2], tcg_ctx->cpu_env, offsetof(CPUSPARCState, qt1) +
                   offsetof(CPU_QuadU, ll.upper));
    tcg_gen_st_i64(tcg_ctx, tcg_ctx->cpu_fpr[src/2 + 1], tcg_ctx->cpu_env, offsetof(CPUSPARCState, qt1) +
                   offsetof(CPU_QuadU, ll.lower));
}